

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O2

void __thiscall
SchemePrimitiveProcedure::SchemePrimitiveProcedure
          (SchemePrimitiveProcedure *this,string *name_,longlong minargs,longlong maxargs)

{
  SchemeProcedure::SchemeProcedure(&this->super_SchemeProcedure);
  (this->super_SchemeProcedure).super_SchemeObject._vptr_SchemeObject =
       (_func_int **)&PTR__SchemeProcedure_001717a0;
  std::__cxx11::string::_M_assign((string *)&(this->super_SchemeProcedure).name);
  (this->super_SchemeProcedure).arity.first = minargs;
  (this->super_SchemeProcedure).arity.second = maxargs;
  return;
}

Assistant:

SchemePrimitiveProcedure(const std::string &name_, long long minargs, long long maxargs)
    {
        name = name_;
        arity.first = minargs;
        arity.second = maxargs;
    }